

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Resize
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,
          hash_t nhsize)

{
  uint uVar1;
  Node *block;
  Node *pNVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  bool bVar6;
  Node *pNVar7;
  Node *n;
  Node *nold;
  uint local_18;
  hash_t oldhsize;
  hash_t i;
  hash_t nhsize_local;
  TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this_local;
  
  uVar1 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    bVar6 = Node::IsNil(block + local_18);
    if (!bVar6) {
      pNVar7 = NewKey(this,block[local_18].Pair.Key);
      (pNVar7->Pair).Value.Type = block[local_18].Pair.Value.Type;
      pNVar2 = block + local_18;
      cVar3 = (pNVar2->Pair).Value.ArgsDefined;
      uVar4 = (pNVar2->Pair).Value.field_0xb;
      iVar5 = (pNVar2->Pair).Value.Args[0];
      (pNVar7->Pair).Value.Special = (pNVar2->Pair).Value.Special;
      (pNVar7->Pair).Value.ArgsDefined = cVar3;
      (pNVar7->Pair).Value.field_0xb = uVar4;
      (pNVar7->Pair).Value.Args[0] = iVar5;
      *(undefined8 *)((pNVar7->Pair).Value.Args + 1) =
           *(undefined8 *)(block[local_18].Pair.Value.Args + 1);
      *(undefined8 *)((pNVar7->Pair).Value.Args + 3) =
           *(undefined8 *)(block[local_18].Pair.Value.Args + 3);
    }
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}